

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_9::DiskHandle::tryTransfer
          (DiskHandle *this,PathPtr toPath,WriteMode toMode,Directory *fromDirectory,
          PathPtr fromPath,TransferMode mode,Directory *self)

{
  PathPtr fromPath_00;
  PathPtr toPath_00;
  long lVar1;
  int fromDirFd;
  bool bVar2;
  size_t sVar3;
  String *pSVar4;
  char *pcVar5;
  char *pcVar6;
  PathPtr PVar7;
  StringPtr toPath_01;
  PathPtr toPath_02;
  StringPtr fromPath_01;
  TransferMode mode_local;
  int error;
  PathPtr toPath_local;
  DebugComparison<unsigned_long,_int> _kjCondition;
  Fault f;
  size_t local_50;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_40;
  
  sVar3 = toPath.parts.size_;
  pSVar4 = toPath.parts.ptr;
  _kjCondition.right = 0;
  _kjCondition.op.content.ptr = " > ";
  _kjCondition.op.content.size_ = 4;
  _kjCondition.result = sVar3 != 0;
  mode_local = mode;
  toPath_local.parts.ptr = pSVar4;
  toPath_local.parts.size_ = sVar3;
  _kjCondition.left = sVar3;
  if (sVar3 == 0) {
    _::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x58e,FAILED,"toPath.size() > 0","_kjCondition,\"can\'t replace self\"",
               &_kjCondition,(char (*) [19])"can\'t replace self");
    _::Debug::Fault::~Fault(&f);
    return false;
  }
  if (mode == MOVE) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)
              ((DebugComparison<kj::TransferMode_&,_kj::TransferMode> *)&_kjCondition,fromDirectory)
    ;
    if ((char)_kjCondition.left != '\0') {
      fromDirFd = _kjCondition.left._4_4_;
      _kjCondition.right = 0;
      _kjCondition.left = (unsigned_long)&mode_local;
      _kjCondition.result = mode_local == MOVE;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if (!_kjCondition.result) {
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::TransferMode&,kj::TransferMode>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x599,FAILED,"mode == TransferMode::MOVE","_kjCondition,",
                   (DebugComparison<kj::TransferMode_&,_kj::TransferMode> *)&_kjCondition);
        _::Debug::Fault::fatal(&f);
      }
      error = 0;
      PathPtr::toString((String *)&_kjCondition,&toPath_local,false);
      pcVar6 = (char *)_kjCondition.left;
      lVar1 = CONCAT44(_kjCondition._12_4_,_kjCondition.right);
      PathPtr::toString((String *)&f,&fromPath,false);
      toPath_01.content.size_ = lVar1 + (ulong)(lVar1 == 0);
      pcVar5 = "";
      if (lVar1 == 0) {
        pcVar6 = "";
      }
      if (local_50 != 0) {
        pcVar5 = (char *)CONCAT44(f.exception._4_4_,f.exception._0_4_);
      }
      fromPath_01.content.size_ = local_50 + (local_50 == 0);
      toPath_01.content.ptr = pcVar6;
      fromPath_01.content.ptr = pcVar5;
      bVar2 = tryCommitReplacement(this,toPath_01,fromDirFd,fromPath_01,toMode,&error);
      Array<char>::~Array((Array<char> *)&f);
      Array<char>::~Array((Array<char> *)&_kjCondition);
      if (bVar2) {
        return true;
      }
      if (error != 0) {
        sVar3 = toPath_local.parts.size_;
        pSVar4 = toPath_local.parts.ptr;
        if (error == 0x12) goto LAB_001e335d;
        if (error == 2) {
          if ((~toMode & 5) != 0) {
            return false;
          }
          if (toPath_local.parts.size_ == 0) {
            return false;
          }
          PVar7 = PathPtr::parent(&toPath_local);
          bVar2 = tryMkdir(this,PVar7,CREATE_PARENT|MODIFY|CREATE,true);
          if (bVar2) {
            toPath_00.parts.size_ = toPath_local.parts.size_;
            toPath_00.parts.ptr = toPath_local.parts.ptr;
            PVar7.parts.size_ = fromPath.parts.size_;
            PVar7.parts.ptr = fromPath.parts.ptr;
            bVar2 = tryTransfer(this,toPath_00,toMode & ~CREATE_PARENT,fromDirectory,PVar7,
                                mode_local,self);
            return bVar2;
          }
        }
        else {
          _::Debug::Fault::Fault<int,kj::PathPtr&,kj::PathPtr&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x5b5,error,"rename(fromPath, toPath)","fromPath, toPath",&fromPath,
                     &toPath_local);
          _::Debug::Fault::~Fault((Fault *)&_kjCondition);
        }
      }
      return false;
    }
  }
  else if (mode == LINK) {
    (**(fromDirectory->super_ReadableDirectory).super_FsNode._vptr_FsNode)(&f,fromDirectory);
    _kjCondition.left = CONCAT71(_kjCondition.left._1_7_,(char)f.exception);
    if ((char)f.exception != '\0') {
      _kjCondition.left = CONCAT44(f.exception._4_4_,(undefined4)_kjCondition.left);
      local_40.ptr = (Iface *)operator_new(0x20);
      (local_40.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00260bf0;
      local_40.ptr[1]._vptr_Iface = (_func_int **)((long)&_kjCondition.left + 4);
      local_40.ptr[2]._vptr_Iface = (_func_int **)&fromPath;
      local_40.ptr[3]._vptr_Iface = (_func_int **)this;
      local_40.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::tryTransfer(kj::PathPtr,kj::WriteMode,kj::Directory_const&,kj::PathPtr,kj::TransferMode,kj::Directory_const&)const::{lambda(kj::StringPtr)#1}>>
            ::instance;
      bVar2 = tryReplaceNode(this,toPath,toMode,(Function<int_(kj::StringPtr)> *)&local_40);
      Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_40);
      return bVar2;
    }
  }
LAB_001e335d:
  fromPath_00.parts.size_ = fromPath.parts.size_;
  fromPath_00.parts.ptr = fromPath.parts.ptr;
  toPath_02.parts.size_ = sVar3;
  toPath_02.parts.ptr = pSVar4;
  bVar2 = Directory::tryTransfer(self,toPath_02,toMode,fromDirectory,fromPath_00,mode_local);
  return bVar2;
}

Assistant:

bool tryTransfer(PathPtr toPath, WriteMode toMode,
                   const Directory& fromDirectory, PathPtr fromPath,
                   TransferMode mode, const Directory& self) const {
    KJ_REQUIRE(toPath.size() > 0, "can't replace self") { return false; }

    if (mode == TransferMode::LINK) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        // Other is a disk directory, so we can hopefully do an efficient move/link.
        return tryReplaceNode(toPath, toMode, [&](StringPtr candidatePath) {
          return linkat(fromFd, fromPath.toString().cStr(), fd, candidatePath.cStr(), 0);
        });
      };
    } else if (mode == TransferMode::MOVE) {
      KJ_IF_SOME(fromFd, fromDirectory.getFd()) {
        KJ_ASSERT(mode == TransferMode::MOVE);

        int error = 0;
        if (tryCommitReplacement(toPath.toString(), fromFd, fromPath.toString(), toMode,
                                 &error)) {
          return true;
        } else switch (error) {
          case 0:
            // Plain old WriteMode precondition failure.
            return false;
          case EXDEV:
            // Can't move between devices. Fall back to default implementation, which does
            // copy/delete.
            break;
          case ENOENT:
            // Either the destination directory doesn't exist or the source path doesn't exist.
            // Unfortunately we don't really know. If CREATE_PARENT was provided, try creating
            // the parent directory. Otherwise, we don't actually need to distinguish between
            // these two errors; just return false.
            if (has(toMode, WriteMode::CREATE) && has(toMode, WriteMode::CREATE_PARENT) &&
                toPath.size() > 0 && tryMkdir(toPath.parent(),
                    WriteMode::CREATE | WriteMode::MODIFY | WriteMode::CREATE_PARENT, true)) {
              // Retry, but make sure we don't try to create the parent again.
              return tryTransfer(toPath, toMode - WriteMode::CREATE_PARENT,
                                 fromDirectory, fromPath, mode, self);
            }
            return false;
          default:
            KJ_FAIL_SYSCALL("rename(fromPath, toPath)", error, fromPath, toPath) {
              return false;
            }
        }
      }
    }

    // OK, we can't do anything efficient using the OS. Fall back to default implementation.
    return self.Directory::tryTransfer(toPath, toMode, fromDirectory, fromPath, mode);
  }